

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

SpectrumDotsTexture *
pbrt::SpectrumDotsTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,
          SpectrumType spectrumType,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SpectrumDotsTexture *pSVar3;
  Allocator alloc_00;
  Allocator alloc_01;
  uintptr_t iptr;
  allocator<char> local_9a;
  allocator<char> local_99;
  undefined1 local_98 [16];
  TextureMapping2DHandle map;
  ulong local_80;
  SpectrumHandle local_78 [4];
  ulong local_58;
  string local_50 [32];
  undefined4 extraout_var_01;
  
  TextureMapping2DHandle::Create(&map,parameters->dict,renderFromTexture,loc,alloc);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
  *(undefined4 *)CONCAT44(extraout_var,iVar1) = 0;
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
  *(undefined4 *)CONCAT44(extraout_var_00,iVar2) = 0x3f800000;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"inside",&local_99);
  alloc_00.memoryResource._4_4_ = 0;
  alloc_00.memoryResource._0_4_ = spectrumType;
  local_58 = CONCAT44(extraout_var_00,iVar2) | 0x1000000000000;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)(local_98 + 8),(string *)parameters,
             (SpectrumHandle *)local_50,(SpectrumType)&local_58,alloc_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"outside",&local_9a);
  local_80 = CONCAT44(extraout_var,iVar1) | 0x1000000000000;
  alloc_01.memoryResource._4_4_ = 0;
  alloc_01.memoryResource._0_4_ = spectrumType;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)local_98,(string *)parameters,local_78,
             (SpectrumType)&local_80,alloc_01);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,8);
  pSVar3 = (SpectrumDotsTexture *)CONCAT44(extraout_var_01,iVar1);
  (pSVar3->mapping).
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  .bits = (uintptr_t)
          map.
          super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
          .bits;
  (pSVar3->outsideDot).
  super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = local_98._8_8_;
  (pSVar3->insideDot).
  super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = local_98._0_8_;
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string(local_50);
  return pSVar3;
}

Assistant:

SpectrumDotsTexture *SpectrumDotsTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    SpectrumType spectrumType, const FileLoc *loc, Allocator alloc) {
    // Initialize 2D texture mapping _map_ from _tp_
    TextureMapping2DHandle map =
        TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);
    SpectrumHandle zero = alloc.new_object<ConstantSpectrum>(0.);
    SpectrumHandle one = alloc.new_object<ConstantSpectrum>(1.);

    return alloc.new_object<SpectrumDotsTexture>(
        map, parameters.GetSpectrumTexture("inside", one, spectrumType, alloc),
        parameters.GetSpectrumTexture("outside", zero, spectrumType, alloc));
}